

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void nukedopn2_reset_chip(void *chip)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  Bit32u i;
  long lVar5;
  uint uVar6;
  int iVar7;
  ym3438_t *opn2;
  uint uVar8;
  uint uVar9;
  
  uVar3 = *chip;
  lVar5 = 0;
  uVar8 = 0;
  do {
    uVar8 = uVar8 | *(int *)((long)chip + lVar5 * 4 + 0x4fc) << ((byte)lVar5 & 0x1f);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  uVar1 = *(undefined4 *)((long)chip + 0x4f4);
  uVar2 = *(undefined4 *)((long)chip + 0x4f8);
  uVar9 = *(uint *)((long)chip + 8);
  uVar6 = *(uint *)((long)chip + 0xc);
  memset(chip,0,0x8548);
  *(uint *)((long)chip + 8) = uVar9;
  *(uint *)((long)chip + 0xc) = uVar6;
  *(undefined8 *)((long)chip + 0x12e) = 0x303030303030303;
  *(undefined8 *)((long)chip + 0x136) = 0x303030303030303;
  *(undefined8 *)((long)chip + 0x13e) = 0x303030303030303;
  lVar5 = -0x18;
  do {
    *(undefined2 *)((long)chip + lVar5 * 2 + 0x1a6) = 0x3ff;
    *(undefined2 *)((long)chip + lVar5 * 2 + 0x176) = 0x3ff;
    *(undefined1 *)((long)chip + lVar5 + 0x408) = 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  *(undefined8 *)((long)chip + 0x4d6) = 0x101010101010101;
  *(undefined4 *)((long)chip + 0x4de) = 0x1010101;
  lVar5 = 0;
  iVar4 = (int)(((ulong)uVar6 * 0x24000) / (ulong)uVar9);
  uVar6 = iVar4 - 0x400;
  uVar9 = -uVar6;
  if (0 < (int)uVar6) {
    uVar9 = uVar6;
  }
  iVar7 = 0x400;
  if (1 < uVar9) {
    iVar7 = iVar4;
  }
  *(int *)((long)chip + 0x518) = iVar7;
  *(undefined8 *)chip = uVar3;
  do {
    *(uint *)((long)chip + lVar5 * 4 + 0x4fc) = (uint)((uVar8 >> ((uint)lVar5 & 0x1f) & 1) != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  *(undefined4 *)((long)chip + 0x4f4) = uVar1;
  *(undefined4 *)((long)chip + 0x4f8) = uVar2;
  return;
}

Assistant:

void nukedopn2_reset_chip(void *chip)
{
    ym3438_t* opn2 = (ym3438_t*)chip;
    Bit32u i;
    DEV_DATA devData;
    UINT32 mute;
    Bit32u type;
    Bit32u filter;
    
    devData = opn2->_devData;
    mute = 0;
    for (i = 0; i < 7; i++)
        mute |= (opn2->mute[i] << i);
    type = opn2->chip_type;
    filter = opn2->use_filter;
    
    NOPN2_Reset(opn2, opn2->clock, opn2->smplRate);
    
    opn2->_devData = devData;
    nukedopn2_set_mute_mask(opn2, mute);
    opn2->chip_type = type;
    opn2->use_filter = filter;
}